

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O2

string * __thiscall
verilogAST::Assign::toString_abi_cxx11_(string *__return_storage_ptr__,Assign *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/verilogAST.cpp:10:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>_&>
    ::_S_vtable._M_arr
    [(this->target).
     super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>_>
     .
     super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>
     .
     super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>
     .
     super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>
     .
     super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>
     .
     super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>_>
     ._M_index]._M_data)(&local_40,(anon_class_1_0_00000001 *)&local_100,&this->target);
  std::operator+(&local_e0,&this->prefix,&local_40);
  std::operator+(&local_c0,&local_e0," ");
  std::operator+(&local_a0,&local_c0,&this->symbol);
  std::operator+(&local_80,&local_a0," ");
  (**(((this->value)._M_t.
       super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
       _M_t.
       super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)._vptr_Node
  )(&local_100);
  std::operator+(&local_60,&local_80,&local_100);
  std::operator+(__return_storage_ptr__,&local_60,";");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Assign::toString() {
  return prefix + variant_to_string(target) + " " + symbol + " " +
         value->toString() + ";";
}